

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_config.cc
# Opt level: O0

bool __thiscall flyd::Config::Load(Config *this,char *pconfName)

{
  int iVar1;
  char *pcVar2;
  string *__x;
  string *__y;
  char *in_RSI;
  value_type *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar3;
  string item_content;
  string item_name;
  char *ptmp;
  char linebuf [501];
  FILE *fp;
  value_type *__x_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string local_260 [32];
  undefined1 local_240 [40];
  char local_218 [504];
  FILE *local_20;
  bool local_1;
  
  local_20 = fopen(in_RSI,"r");
  if (local_20 == (FILE *)0x0) {
    local_1 = false;
  }
  else {
    while (iVar1 = feof(local_20), iVar1 == 0) {
      pcVar2 = fgets(local_218,500,local_20);
      if ((((((pcVar2 != (char *)0x0) && (local_218[0] != '\0')) && (local_218[0] != ';')) &&
           ((local_218[0] != ' ' && (local_218[0] != '#')))) &&
          ((local_218[0] != '\t' && ((local_218[0] != '\n' && (local_218[0] != '\0')))))) &&
         ((local_218[0] != '[' &&
          (local_240._32_8_ = strchr(local_218,0x3d), (char *)local_240._32_8_ != (char *)0x0)))) {
        this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_240;
        std::__cxx11::string::string((string *)this_00);
        std::__cxx11::string::string(local_260);
        std::__cxx11::string::append((char *)this_00,(ulong)local_218);
        std::__cxx11::string::append((char *)local_260);
        __x = Trim((string *)0x133544);
        std::__cxx11::string::operator=((string *)local_240,(string *)__x);
        __y = Trim((string *)0x13356c);
        std::__cxx11::string::operator=(local_260,(string *)__y);
        __x_00 = in_RDI;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (this_00,__x,__y);
        pVar3 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)__y,__x_00);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)pVar3.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   ._M_cur.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               );
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string((string *)local_240);
      }
    }
    fclose(local_20);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Config::Load(const char *pconfName)
{
    FILE *fp;
    fp = fopen(pconfName, "r");
    if(fp == NULL) {
        return false;
    }
    //每一行配置文件读出来都放在这里
    char linebuf[501];//每行配置都不要太长，保持<500字符
    //文件成功打开
    while(!feof(fp)) //检查文件是否结束
    {
        if(fgets(linebuf, 500, fp) == NULL)//从文件中读出一行,若空则重新读
            continue;

        if(linebuf[0] == 0)
            continue;

        //处理注释行
        if(*linebuf == ';' || *linebuf == ' '
        || *linebuf == '#' || *linebuf == '\t' || *linebuf == '\n')
            continue;

        if(linebuf[0] == 0)
            continue;
        if(*linebuf == '[')
            continue;

        //开始处理实际有效的配置文件
        char *ptmp = strchr(linebuf, '=');//获得“=”的地址
        if(ptmp != NULL)
        {
            std::string item_name, item_content;

            item_name.append(linebuf, (int)(ptmp - linebuf));
            item_content.append(ptmp + 1);
            item_name = Trim(item_name);
            item_content = Trim(item_content);

            config_map_.insert({item_name, item_content});
        }
    }  //end while(!feof(fp))
    ::fclose(fp);
    return true;
}